

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.c
# Opt level: O1

_Bool compare_submesh_geometry(scene_node *left,scene_node *right)

{
  if ((left->type != SUBMESH_GEOMETRY) || (right->type != SUBMESH_GEOMETRY)) {
    __assert_fail("left->type == SUBMESH_GEOMETRY && left->type == right->type",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/madmann91[P]rt/src/scene/geometry.c"
                  ,0x67,
                  "_Bool compare_submesh_geometry(const struct scene_node *, const struct scene_node *)"
                 );
  }
  if ((left[2].hash == right[2].hash) && (left[2].compare == right[2].compare)) {
    return left[2].cleanup == right[2].cleanup;
  }
  return false;
}

Assistant:

static bool compare_submesh_geometry(const struct scene_node* left, const struct scene_node* right) {
    assert(left->type == SUBMESH_GEOMETRY && left->type == right->type);
    struct submesh_geometry* left_submesh_geometry  = (void*)left;
    struct submesh_geometry* right_submesh_geometry = (void*)right;
    return
        left_submesh_geometry->mesh  == right_submesh_geometry->mesh &&
        left_submesh_geometry->begin == right_submesh_geometry->begin &&
        left_submesh_geometry->end   == right_submesh_geometry->end;
}